

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetCommand.cxx
# Opt level: O2

bool cmSetCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *args,cmExecutionStatus *status)

{
  long lVar1;
  string *var;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  CacheEntryType CVar5;
  ulong uVar6;
  cmState *this;
  cmValue cVar7;
  pointer pbVar8;
  long lVar9;
  uint uVar10;
  pointer pbVar11;
  uint uVar12;
  cmValue doc;
  string_view value_00;
  string_view str;
  string putEnvArg;
  string value;
  string currValue;
  CacheEntryType type;
  ulong local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  var = (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if (var == (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value,"called with incorrect number of arguments",
               (allocator<char> *)&putEnvArg);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&value);
    return false;
  }
  str._M_str = (var->_M_dataplus)._M_p;
  str._M_len = var->_M_string_length;
  bVar2 = cmHasLiteralPrefix<5ul>(str,(char (*) [5])"ENV{");
  if ((bVar2) && (5 < var->_M_string_length)) {
    std::__cxx11::string::substr((ulong)&value,(ulong)var);
    std::operator+(&putEnvArg,&value,"=");
    currValue._M_dataplus._M_p = (pointer)&currValue.field_2;
    currValue._M_string_length = 0;
    currValue.field_2._M_local_buf[0] = '\0';
    bVar2 = cmsys::SystemTools::GetEnv(&value,&currValue);
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((ulong)((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) < 0x21) ||
       (pbVar8[1]._M_string_length == 0)) {
      if (bVar2) {
        cmsys::SystemTools::PutEnv(&putEnvArg);
      }
    }
    else {
      if ((!bVar2) || (bVar2 = std::operator!=(&currValue,pbVar8 + 1), bVar2)) {
        std::__cxx11::string::append((string *)&putEnvArg);
        cmsys::SystemTools::PutEnv(&putEnvArg);
      }
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (0x40 < (ulong)((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8)) {
        std::operator+(&local_50,
                       "Only the first value argument is used when setting an environment variable.  Argument \'"
                       ,pbVar8 + 2);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                       &local_50,"\' and later are unused.");
        std::__cxx11::string::~string((string *)&local_50);
        cmMakefile::IssueMessage(status->Makefile,AUTHOR_WARNING,(string *)&type);
        std::__cxx11::string::~string((string *)&type);
      }
    }
    std::__cxx11::string::~string((string *)&currValue);
    std::__cxx11::string::~string((string *)&putEnvArg);
    std::__cxx11::string::~string((string *)&value);
    return true;
  }
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = (long)pbVar11 - (long)pbVar8;
  if ((long)uVar6 >> 5 == 2) {
    bVar2 = std::operator==(pbVar11 + -1,"PARENT_SCOPE");
    if (bVar2) {
      cmMakefile::RaiseScope(status->Makefile,var,(char *)0x0);
      return true;
    }
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar11 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    uVar6 = (long)pbVar11 - (long)pbVar8;
  }
  else if ((long)uVar6 >> 5 == 1) {
    cmMakefile::RemoveDefinition(status->Makefile,var);
    return true;
  }
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  type = STRING;
  if (uVar6 < 0x21) {
LAB_003ede7e:
    bVar2 = false;
    uVar12 = 0;
LAB_003ede81:
    if ((ulong)((long)uVar6 >> 5) < 4) {
      bVar4 = false;
      uVar10 = uVar12;
      goto LAB_003edecb;
    }
    bVar3 = std::operator==(pbVar8 + (((long)uVar6 >> 5) - (ulong)bVar2) + -3,"CACHE");
    uVar10 = uVar12 + 3;
    if (!bVar3) {
      uVar10 = uVar12;
    }
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar11 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = false;
  }
  else {
    bVar2 = std::operator==(pbVar11 + -1,"PARENT_SCOPE");
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar11 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (!bVar2) {
      uVar6 = (long)pbVar11 - (long)pbVar8;
      if (uVar6 < 0x81) goto LAB_003ede7e;
      bVar2 = std::operator==(pbVar11 + -1,"FORCE");
      uVar12 = (uint)bVar2;
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      uVar6 = (long)pbVar11 - (long)pbVar8;
      goto LAB_003ede81;
    }
    bVar4 = true;
    bVar2 = false;
    uVar10 = 1;
LAB_003edecb:
    bVar3 = false;
  }
  currValue._M_dataplus._M_p = (pointer)(pbVar8 + 1);
  currValue._M_string_length = (long)pbVar11 - (ulong)(uVar10 << 5);
  cmList::
  to_string<cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_0>
            (&putEnvArg,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&currValue);
  std::__cxx11::string::operator=((string *)&value,(string *)&putEnvArg);
  std::__cxx11::string::~string((string *)&putEnvArg);
  if (bVar4) {
    bVar4 = true;
    cmMakefile::RaiseScope(status->Makefile,var,value._M_dataplus._M_p);
  }
  else {
    bVar4 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish + -1,"CACHE");
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&putEnvArg,
                 "given invalid arguments for CACHE mode: missing type and docstring",
                 (allocator<char> *)&currValue);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar6 = (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8;
      if ((uVar6 < 0x21) ||
         (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)pbVar8 + (uVar6 - 0x40)),"CACHE"), !bVar4)) {
        if (bVar2 != true || bVar3 != false) {
          local_58 = (ulong)bVar2;
          if (bVar3 == false) {
            doc.Value = (string *)0x0;
          }
          else {
            pbVar8 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar9 = ((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) -
                    local_58;
            lVar1 = lVar9 + -2;
            bVar4 = cmState::StringToCacheEntryType(pbVar8 + lVar1,&type);
            if (!bVar4) {
              std::operator+(&currValue,"implicitly converting \'",
                             (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar1);
              std::operator+(&putEnvArg,&currValue,"\' to \'STRING\' type.");
              std::__cxx11::string::~string((string *)&currValue);
              cmMakefile::IssueMessage(status->Makefile,AUTHOR_WARNING,&putEnvArg);
              type = STRING;
              std::__cxx11::string::~string((string *)&putEnvArg);
            }
            doc.Value = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + lVar9 + -1;
          }
          this = cmMakefile::GetState(status->Makefile);
          cVar7 = cmState::GetCacheEntryValue(this,var);
          if ((((cVar7.Value == (string *)0x0) ||
               (CVar5 = cmState::GetCacheEntryType(this,var), CVar5 == UNINITIALIZED)) ||
              (bVar3 == false)) || ((type == INTERNAL || (bVar4 = true, bVar2 != false)))) {
            bVar4 = true;
            if (bVar3 == false) {
              value_00._M_str = value._M_dataplus._M_p;
              value_00._M_len = value._M_string_length;
              cmMakefile::AddDefinition(status->Makefile,var,value_00);
            }
            else {
              cmMakefile::AddCacheDefinition(status->Makefile,var,&value,doc,type,SUB81(local_58,0))
              ;
            }
          }
          goto LAB_003ee0b3;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&putEnvArg,"given invalid arguments: FORCE specified without CACHE",
                   (allocator<char> *)&currValue);
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&putEnvArg,
                   "given invalid arguments for CACHE mode: missing type or docstring",
                   (allocator<char> *)&currValue);
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
    }
    std::__cxx11::string::~string((string *)&putEnvArg);
    bVar4 = false;
  }
LAB_003ee0b3:
  std::__cxx11::string::~string((string *)&value);
  return bVar4;
}

Assistant:

bool cmSetCommand(std::vector<std::string> const& args,
                  cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // watch for ENV signatures
  auto const& variable = args[0]; // VAR is always first
  if (cmHasLiteralPrefix(variable, "ENV{") && variable.size() > 5) {
    // what is the variable name
    auto const& varName = variable.substr(4, variable.size() - 5);
    std::string putEnvArg = varName + "=";

    // what is the current value if any
    std::string currValue;
    const bool currValueSet = cmSystemTools::GetEnv(varName, currValue);

    // will it be set to something, then set it
    if (args.size() > 1 && !args[1].empty()) {
      // but only if it is different from current value
      if (!currValueSet || currValue != args[1]) {
        putEnvArg += args[1];
        cmSystemTools::PutEnv(putEnvArg);
      }
      // if there's extra arguments, warn user
      // that they are ignored by this command.
      if (args.size() > 2) {
        std::string m = "Only the first value argument is used when setting "
                        "an environment variable.  Argument '" +
          args[2] + "' and later are unused.";
        status.GetMakefile().IssueMessage(MessageType::AUTHOR_WARNING, m);
      }
      return true;
    }

    // if it will be cleared, then clear it if it isn't already clear
    if (currValueSet) {
      cmSystemTools::PutEnv(putEnvArg);
    }
    return true;
  }

  // SET (VAR) // Removes the definition of VAR.
  if (args.size() == 1) {
    status.GetMakefile().RemoveDefinition(variable);
    return true;
  }
  // SET (VAR PARENT_SCOPE) // Removes the definition of VAR
  // in the parent scope.
  if (args.size() == 2 && args.back() == "PARENT_SCOPE") {
    status.GetMakefile().RaiseScope(variable, nullptr);
    return true;
  }

  // here are the remaining options
  //  SET (VAR value )
  //  SET (VAR value PARENT_SCOPE)
  //  SET (VAR CACHE TYPE "doc String" [FORCE])
  //  SET (VAR value CACHE TYPE "doc string" [FORCE])
  std::string value;  // optional
  bool cache = false; // optional
  bool force = false; // optional
  bool parentScope = false;
  cmStateEnums::CacheEntryType type =
    cmStateEnums::STRING; // required if cache
  cmValue docstring;      // required if cache

  unsigned int ignoreLastArgs = 0;
  // look for PARENT_SCOPE argument
  if (args.size() > 1 && args.back() == "PARENT_SCOPE") {
    parentScope = true;
    ignoreLastArgs++;
  } else {
    // look for FORCE argument
    if (args.size() > 4 && args.back() == "FORCE") {
      force = true;
      ignoreLastArgs++;
    }

    // check for cache signature
    if (args.size() > 3 &&
        args[args.size() - 3 - (force ? 1 : 0)] == "CACHE") {
      cache = true;
      ignoreLastArgs += 3;
    }
  }

  // collect any values into a single semi-colon separated value list
  value =
    cmList::to_string(cmMakeRange(args).advance(1).retreat(ignoreLastArgs));

  if (parentScope) {
    status.GetMakefile().RaiseScope(variable, value.c_str());
    return true;
  }

  // we should be nice and try to catch some simple screwups if the last or
  // next to last args are CACHE then they screwed up.  If they used FORCE
  // without CACHE they screwed up
  if (args.back() == "CACHE") {
    status.SetError(
      "given invalid arguments for CACHE mode: missing type and docstring");
    return false;
  }
  if (args.size() > 1 && args[args.size() - 2] == "CACHE") {
    status.SetError(
      "given invalid arguments for CACHE mode: missing type or docstring");
    return false;
  }
  if (force && !cache) {
    status.SetError("given invalid arguments: FORCE specified without CACHE");
    return false;
  }

  if (cache) {
    std::string::size_type cacheStart = args.size() - 3 - (force ? 1 : 0);
    if (!cmState::StringToCacheEntryType(args[cacheStart + 1], type)) {
      std::string m = "implicitly converting '" + args[cacheStart + 1] +
        "' to 'STRING' type.";
      status.GetMakefile().IssueMessage(MessageType::AUTHOR_WARNING, m);
      // Setting this may not be required, since it's
      // initialized as a string. Keeping this here to
      // ensure that the type is actually converting to a string.
      type = cmStateEnums::STRING;
    }
    docstring = cmValue{ args[cacheStart + 2] };
  }

  // see if this is already in the cache
  cmState* state = status.GetMakefile().GetState();
  cmValue existingValue = state->GetCacheEntryValue(variable);
  if (existingValue &&
      (state->GetCacheEntryType(variable) != cmStateEnums::UNINITIALIZED)) {
    // if the set is trying to CACHE the value but the value
    // is already in the cache and the type is not internal
    // then leave now without setting any definitions in the cache
    // or the makefile
    if (cache && type != cmStateEnums::INTERNAL && !force) {
      return true;
    }
  }

  // if it is meant to be in the cache then define it in the cache
  if (cache) {
    status.GetMakefile().AddCacheDefinition(variable, cmValue{ value },
                                            docstring, type, force);
  } else {
    // add the definition
    status.GetMakefile().AddDefinition(variable, value);
  }
  return true;
}